

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

void cm_expat_XML_ParserFree(XML_Parser parser)

{
  long lVar1;
  long lVar2;
  long lVar3;
  undefined8 *puVar4;
  void *__src;
  long lVar5;
  DTD tem;
  undefined1 local_160 [312];
  
  do {
    puVar4 = *(undefined8 **)((long)parser + 0x3d0);
    if (puVar4 == (undefined8 *)0x0) {
      puVar4 = *(undefined8 **)((long)parser + 0x3d8);
      if (puVar4 == (undefined8 *)0x0) {
        lVar2 = *(long *)((long)parser + 1000);
        while (lVar2 != 0) {
          lVar1 = *(long *)(lVar2 + 8);
          (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar2 + 0x20));
          (**(code **)((long)parser + 0x28))(lVar2);
          lVar2 = lVar1;
        }
        lVar2 = *(long *)((long)parser + 0x3e0);
        while (lVar2 != 0) {
          lVar1 = *(long *)(lVar2 + 8);
          (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar2 + 0x20));
          (**(code **)((long)parser + 0x28))(lVar2);
          lVar2 = lVar1;
        }
        poolDestroy((STRING_POOL *)((long)parser + 0x418));
        poolDestroy((STRING_POOL *)((long)parser + 0x448));
        if (*(long *)((long)parser + 0x490) != 0) {
          if (*(int *)((long)parser + 0x484) != 0) {
            *(undefined4 *)((long)parser + 0x360) = 0;
          }
          __src = (void *)(*(long *)((long)parser + 0x490) + 0x290);
          memcpy(local_160,(void *)((long)parser + 0x290),0x138);
          memcpy((void *)((long)parser + 0x290),__src,0x138);
          memcpy(__src,local_160,0x138);
        }
        lVar2 = *(long *)((long)parser + 0x2b8);
        lVar1 = *(long *)((long)parser + 0x2c0);
        for (lVar5 = 0; lVar1 << 3 != lVar5; lVar5 = lVar5 + 8) {
          lVar3 = *(long *)(lVar2 + lVar5);
          if ((lVar3 != 0) && (*(int *)(lVar3 + 0x1c) != 0)) {
            (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar3 + 0x20));
          }
        }
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x290));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x368));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x2b8));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x2e0));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x308));
        poolDestroy((STRING_POOL *)((long)parser + 0x330));
        if (*(long *)((long)parser + 0x3c0) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        if (*(long *)((long)parser + 0x3a8) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x400));
        if (*(long *)((long)parser + 0x478) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        if (*(long *)((long)parser + 0x10) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x58));
        if (*(long *)((long)parser + 0x1d0) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        if (*(code **)((long)parser + 0x1e8) != (code *)0x0) {
          (**(code **)((long)parser + 0x1e8))(*(undefined8 *)((long)parser + 0x1d8));
        }
        (**(code **)((long)parser + 0x28))();
        return;
      }
      *(undefined8 *)((long)parser + 0x3d8) = 0;
    }
    *(undefined8 *)((long)parser + 0x3d0) = *puVar4;
    (**(code **)((long)parser + 0x28))(puVar4[6]);
    lVar2 = puVar4[8];
    while (lVar2 != 0) {
      lVar1 = *(long *)(lVar2 + 8);
      (**(code **)((long)parser + 0x28))(*(undefined8 *)(lVar2 + 0x20));
      (**(code **)((long)parser + 0x28))(lVar2);
      lVar2 = lVar1;
    }
    (**(code **)((long)parser + 0x28))(puVar4);
  } while( true );
}

Assistant:

void XML_ParserFree(XML_Parser parser)
{
  for (;;) {
    TAG *p;
    if (tagStack == 0) {
      if (freeTagList == 0)
        break;
      tagStack = freeTagList;
      freeTagList = 0;
    }
    p = tagStack;
    tagStack = tagStack->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
#ifdef XML_DTD
  if (parentParser) {
    if (hadExternalDoctype)
      dtd.complete = 0;
    dtdSwap(&dtd, &((Parser *)parentParser)->m_dtd);
  }
#endif /* XML_DTD */
  dtdDestroy(&dtd, parser);
  FREE((void *)atts);
  if (groupConnector)
    FREE(groupConnector);
  if (buffer)
    FREE(buffer);
  FREE(dataBuf);
  if (unknownEncodingMem)
    FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}